

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArraySampling.cpp
# Opt level: O0

void __thiscall
glcts::TextureCubeMapArraySamplingTest::logProgram
          (TextureCubeMapArraySamplingTest *this,programDefinition *info)

{
  TestLog *this_00;
  MessageBuilder *pMVar1;
  shaderDefinition *this_01;
  shaderDefinition *this_02;
  shaderDefinition *this_03;
  shaderDefinition *this_04;
  shaderDefinition *this_05;
  shaderDefinition *this_06;
  string *psVar2;
  shaderDefinition *vertex;
  shaderDefinition *tes;
  shaderDefinition *tcs;
  shaderDefinition *geometry;
  shaderDefinition *fragment;
  shaderDefinition *compute;
  undefined1 local_1a0 [8];
  MessageBuilder message;
  GLuint program_object_id;
  programDefinition *info_local;
  TextureCubeMapArraySamplingTest *this_local;
  
  message.m_str._372_4_ = programDefinition::getProgramId(info);
  if (message.m_str._372_4_ != 0) {
    this_00 = tcu::TestContext::getLog
                        ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<
              ((MessageBuilder *)local_1a0,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar1 = tcu::MessageBuilder::operator<<
                       ((MessageBuilder *)local_1a0,(char (*) [13])"Program id: ");
    tcu::MessageBuilder::operator<<(pMVar1,(uint *)&message.m_str.field_0x174);
    this_01 = programDefinition::getShader(info,Compute);
    this_02 = programDefinition::getShader(info,Fragment);
    this_03 = programDefinition::getShader(info,Geometry);
    this_04 = programDefinition::getShader(info,Tesselation_Control);
    this_05 = programDefinition::getShader(info,Tesselation_Evaluation);
    this_06 = programDefinition::getShader(info,Vertex);
    if (this_01 != (shaderDefinition *)0x0) {
      pMVar1 = tcu::MessageBuilder::operator<<
                         ((MessageBuilder *)local_1a0,(char (*) [18])"\nCompute shader:\n");
      psVar2 = shaderDefinition::getSource_abi_cxx11_(this_01);
      tcu::MessageBuilder::operator<<(pMVar1,psVar2);
    }
    if (this_06 != (shaderDefinition *)0x0) {
      pMVar1 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_1a0,(char (*) [17])0x29a9ca4)
      ;
      psVar2 = shaderDefinition::getSource_abi_cxx11_(this_06);
      tcu::MessageBuilder::operator<<(pMVar1,psVar2);
    }
    if (this_03 != (shaderDefinition *)0x0) {
      pMVar1 = tcu::MessageBuilder::operator<<
                         ((MessageBuilder *)local_1a0,(char (*) [19])"\nGeometry shader:\n");
      psVar2 = shaderDefinition::getSource_abi_cxx11_(this_03);
      tcu::MessageBuilder::operator<<(pMVar1,psVar2);
    }
    if (this_04 != (shaderDefinition *)0x0) {
      pMVar1 = tcu::MessageBuilder::operator<<
                         ((MessageBuilder *)local_1a0,(char (*) [14])"\nTCS shader:\n");
      psVar2 = shaderDefinition::getSource_abi_cxx11_(this_04);
      tcu::MessageBuilder::operator<<(pMVar1,psVar2);
    }
    if (this_05 != (shaderDefinition *)0x0) {
      pMVar1 = tcu::MessageBuilder::operator<<
                         ((MessageBuilder *)local_1a0,(char (*) [14])"\nTES shader:\n");
      psVar2 = shaderDefinition::getSource_abi_cxx11_(this_05);
      tcu::MessageBuilder::operator<<(pMVar1,psVar2);
    }
    if (this_02 != (shaderDefinition *)0x0) {
      pMVar1 = tcu::MessageBuilder::operator<<
                         ((MessageBuilder *)local_1a0,(char (*) [19])"\nFragment shader:\n");
      psVar2 = shaderDefinition::getSource_abi_cxx11_(this_02);
      tcu::MessageBuilder::operator<<(pMVar1,psVar2);
    }
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_1a0);
  }
  return;
}

Assistant:

void TextureCubeMapArraySamplingTest::logProgram(const programDefinition& info)
{
	glw::GLuint program_object_id = info.getProgramId();

	if (programDefinition::m_invalid_program_object_id == program_object_id)
	{
		return;
	}

	tcu::MessageBuilder message = m_testCtx.getLog() << tcu::TestLog::Message;

	message << "Program id: " << program_object_id;

	const shaderDefinition* compute  = info.getShader(Compute);
	const shaderDefinition* fragment = info.getShader(Fragment);
	const shaderDefinition* geometry = info.getShader(Geometry);
	const shaderDefinition* tcs		 = info.getShader(Tesselation_Control);
	const shaderDefinition* tes		 = info.getShader(Tesselation_Evaluation);
	const shaderDefinition* vertex   = info.getShader(Vertex);

	if (0 != compute)
	{
		message << "\nCompute shader:\n" << compute->getSource();
	}

	if (0 != vertex)
	{
		message << "\nVertex shader:\n" << vertex->getSource();
	}

	if (0 != geometry)
	{
		message << "\nGeometry shader:\n" << geometry->getSource();
	}

	if (0 != tcs)
	{
		message << "\nTCS shader:\n" << tcs->getSource();
	}

	if (0 != tes)
	{
		message << "\nTES shader:\n" << tes->getSource();
	}

	if (0 != fragment)
	{
		message << "\nFragment shader:\n" << fragment->getSource();
	}

	message << tcu::TestLog::EndMessage;
}